

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<tinyusdz::Token> * __thiscall
tinyusdz::MetaVariable::get_value<tinyusdz::Token>
          (optional<tinyusdz::Token> *__return_storage_ptr__,MetaVariable *this)

{
  Token *value;
  
  value = tinyusdz::value::Value::as<tinyusdz::Token>(&this->_value,false);
  if (value == (Token *)0x0) {
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
  }
  else {
    nonstd::optional_lite::optional<tinyusdz::Token>::optional<const_tinyusdz::Token_&,_0>
              (__return_storage_ptr__,value);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    if (const T *v = _value.as<T>()) {
      return *v;
    }

    return nonstd::nullopt;
  }